

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFormatTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::TextureFormatTests::init(TextureFormatTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 dataType;
  TestContext *pTVar2;
  Context *pCVar3;
  RenderContext *pRVar4;
  ContextInfo *pCVar5;
  TestNode *node;
  TestNode *node_00;
  TestNode *pTVar6;
  char *pcVar7;
  long *plVar8;
  TextureCubeArrayFormatCase *pTVar9;
  TextureBufferFormatCase *pTVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long *plVar12;
  size_type *psVar13;
  long lVar14;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0 [2];
  long local_c0 [2];
  string descriptionBase;
  string nameBase;
  allocator<char> local_49;
  TextureCubeArrayFormatCase *local_48;
  TestNode *local_40;
  TestNode *local_38;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"unsized",
             "Unsized formats");
  tcu::TestNode::addChild((TestNode *)this,node);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sized",
             "Sized formats");
  tcu::TestNode::addChild((TestNode *)this,node_00);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"buffer",
             "Sized formats (Buffer)");
  local_40 = pTVar6;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube_array",
             "Sized formats (2D Array)");
  tcu::TestNode::addChild(node_00,pTVar6);
  lVar14 = 0;
  local_38 = node;
  do {
    dVar1 = *(deUint32 *)((long)&DAT_00b2f7c8 + lVar14);
    dataType = *(deUint32 *)((long)&DAT_00b2f7cc + lVar14);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)((long)&DAT_00b2f7c0 + lVar14),
               (allocator<char> *)&descriptionBase);
    pcVar7 = glu::getTextureFormatName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d0,pcVar7,&local_49);
    plVar8 = (long *)std::__cxx11::string::append((char *)local_d0);
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_e0 = *plVar12;
      lStack_d8 = plVar8[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar12;
      local_f0 = (long *)*plVar8;
    }
    local_e8 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    glu::getTypeName(dataType);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
    psVar13 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar13) {
      descriptionBase.field_2._M_allocated_capacity = *psVar13;
      descriptionBase.field_2._8_8_ = plVar8[3];
      descriptionBase._M_dataplus._M_p = (pointer)&descriptionBase.field_2;
    }
    else {
      descriptionBase.field_2._M_allocated_capacity = *psVar13;
      descriptionBase._M_dataplus._M_p = (pointer)*plVar8;
    }
    descriptionBase._M_string_length = plVar8[1];
    *plVar8 = (long)psVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    local_48 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pRVar4 = pCVar3->m_renderCtx;
    pCVar5 = pCVar3->m_contextInfo;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_f0);
    plVar8 = local_f0;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)local_d0);
    pTVar9 = local_48;
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (local_48,pTVar2,pRVar4,pCVar5,(char *)plVar8,(char *)local_d0[0],dVar1,dataType,0x40,
               0xc);
    tcu::TestNode::addChild(local_38,(TestNode *)pTVar9);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    local_48 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pRVar4 = pCVar3->m_renderCtx;
    pCVar5 = pCVar3->m_contextInfo;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_f0);
    plVar8 = local_f0;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)local_d0);
    pTVar9 = local_48;
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (local_48,pTVar2,pRVar4,pCVar5,(char *)plVar8,(char *)local_d0[0],dVar1,dataType,0x40,
               0xc);
    tcu::TestNode::addChild(local_38,(TestNode *)pTVar9);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)descriptionBase._M_dataplus._M_p != &descriptionBase.field_2) {
      operator_delete(descriptionBase._M_dataplus._M_p,
                      descriptionBase.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)nameBase._M_dataplus._M_p != &nameBase.field_2) {
      operator_delete(nameBase._M_dataplus._M_p,nameBase.field_2._M_allocated_capacity + 1);
    }
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x80);
  lVar14 = 8;
  do {
    dVar1 = *(deUint32 *)((long)&PTR_anon_var_dwarf_65a453_00b2f840 + lVar14);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)(&UNK_00b2f838 + lVar14),
               (allocator<char> *)&descriptionBase);
    pcVar7 = glu::getTextureFormatName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&descriptionBase,pcVar7,(allocator<char> *)&local_f0);
    pTVar9 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pRVar4 = pCVar3->m_renderCtx;
    pCVar5 = pCVar3->m_contextInfo;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_f0);
    plVar8 = local_f0;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)local_d0);
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (pTVar9,pTVar2,pRVar4,pCVar5,(char *)plVar8,(char *)local_d0[0],dVar1,0x40,0xc);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    pTVar9 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pRVar4 = pCVar3->m_renderCtx;
    pCVar5 = pCVar3->m_contextInfo;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_f0);
    plVar8 = local_f0;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)local_d0);
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (pTVar9,pTVar2,pRVar4,pCVar5,(char *)plVar8,(char *)local_d0[0],dVar1,0x40,0xc);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)descriptionBase._M_dataplus._M_p != &descriptionBase.field_2) {
      operator_delete(descriptionBase._M_dataplus._M_p,
                      descriptionBase.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)nameBase._M_dataplus._M_p != &nameBase.field_2) {
      operator_delete(nameBase._M_dataplus._M_p,nameBase.field_2._M_allocated_capacity + 1);
    }
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x318);
  lVar14 = 8;
  do {
    dVar1 = *(deUint32 *)((long)&PTR_anon_var_dwarf_65a689_00b2fb50 + lVar14);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)(&UNK_00b2fb48 + lVar14),
               (allocator<char> *)&descriptionBase);
    pcVar7 = glu::getTextureFormatName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&descriptionBase,pcVar7,(allocator<char> *)&local_f0);
    pTVar9 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pRVar4 = pCVar3->m_renderCtx;
    pCVar5 = pCVar3->m_contextInfo;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_f0);
    plVar8 = local_f0;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)local_d0);
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (pTVar9,pTVar2,pRVar4,pCVar5,(char *)plVar8,(char *)local_d0[0],dVar1,0x40,0xc);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    pTVar9 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pRVar4 = pCVar3->m_renderCtx;
    pCVar5 = pCVar3->m_contextInfo;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_f0);
    plVar8 = local_f0;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)local_d0);
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (pTVar9,pTVar2,pRVar4,pCVar5,(char *)plVar8,(char *)local_d0[0],dVar1,0x40,0xc);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)descriptionBase._M_dataplus._M_p != &descriptionBase.field_2) {
      operator_delete(descriptionBase._M_dataplus._M_p,
                      descriptionBase.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)nameBase._M_dataplus._M_p != &nameBase.field_2) {
      operator_delete(nameBase._M_dataplus._M_p,nameBase.field_2._M_allocated_capacity + 1);
    }
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x58);
  lVar14 = 8;
  do {
    dVar1 = *(deUint32 *)((long)&DAT_00b2fba0 + lVar14);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)(&UNK_00b2fb98 + lVar14),
               (allocator<char> *)&descriptionBase);
    pcVar7 = glu::getTextureFormatName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&descriptionBase,pcVar7,(allocator<char> *)&local_f0);
    pTVar10 = (TextureBufferFormatCase *)operator_new(0xf0);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pRVar4 = pCVar3->m_renderCtx;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_f0);
    plVar8 = local_f0;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)local_d0);
    TextureBufferFormatCase::TextureBufferFormatCase
              (pTVar10,pCVar3,pRVar4,(char *)plVar8,(char *)local_d0[0],dVar1,0x40);
    tcu::TestNode::addChild(local_40,(TestNode *)pTVar10);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    pTVar10 = (TextureBufferFormatCase *)operator_new(0xf0);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pRVar4 = pCVar3->m_renderCtx;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_f0);
    plVar8 = local_f0;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)local_d0);
    TextureBufferFormatCase::TextureBufferFormatCase
              (pTVar10,pCVar3,pRVar4,(char *)plVar8,(char *)local_d0[0],dVar1,0x70);
    tcu::TestNode::addChild(local_40,(TestNode *)pTVar10);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)descriptionBase._M_dataplus._M_p != &descriptionBase.field_2) {
      operator_delete(descriptionBase._M_dataplus._M_p,
                      descriptionBase.field_2._M_allocated_capacity + 1);
    }
    paVar11 = &nameBase.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)nameBase._M_dataplus._M_p != paVar11) {
      operator_delete(nameBase._M_dataplus._M_p,nameBase.field_2._M_allocated_capacity + 1);
      paVar11 = extraout_RAX;
    }
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x1b8);
  return (int)paVar11;
}

Assistant:

void TextureFormatTests::init (void)
{
	tcu::TestCaseGroup* unsizedGroup	= DE_NULL;
	tcu::TestCaseGroup*	sizedGroup		= DE_NULL;
	tcu::TestCaseGroup*	sizedBufferGroup = DE_NULL;
	addChild((unsizedGroup		= new tcu::TestCaseGroup(m_testCtx,	"unsized",	"Unsized formats")));
	addChild((sizedGroup		= new tcu::TestCaseGroup(m_testCtx,	"sized",	"Sized formats")));
	addChild((sizedBufferGroup	= new tcu::TestCaseGroup(m_testCtx,	"buffer",	"Sized formats (Buffer)")));

	tcu::TestCaseGroup*	sizedCubeArrayGroup	= DE_NULL;
	sizedGroup->addChild((sizedCubeArrayGroup = new tcu::TestCaseGroup(m_testCtx, "cube_array", "Sized formats (2D Array)")));

	struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} texFormats[] =
	{
		{ "alpha",							GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "luminance",						GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "luminance_alpha",				GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb_unsigned_short_5_6_5",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb_unsigned_byte",				GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba_unsigned_short_4_4_4_4",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba_unsigned_short_5_5_5_1",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba_unsigned_byte",				GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		deUint32	format		= texFormats[formatNdx].format;
		deUint32	dataType	= texFormats[formatNdx].dataType;
		string	nameBase		= texFormats[formatNdx].name;
		string	descriptionBase	= string(glu::getTextureFormatName(format)) + ", " + glu::getTypeName(dataType);

		unsizedGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_cube_array_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), format, dataType, 64, 12));
		unsizedGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_cube_array_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), format, dataType, 64, 12));
	}

	struct
	{
		const char*	name;
		deUint32	internalFormat;
	} sizedColorFormats[] =
	{
		{ "rgba32f",			GL_RGBA32F,			},
		{ "rgba32i",			GL_RGBA32I,			},
		{ "rgba32ui",			GL_RGBA32UI,		},
		{ "rgba16f",			GL_RGBA16F,			},
		{ "rgba16i",			GL_RGBA16I,			},
		{ "rgba16ui",			GL_RGBA16UI,		},
		{ "rgba8",				GL_RGBA8,			},
		{ "rgba8i",				GL_RGBA8I,			},
		{ "rgba8ui",			GL_RGBA8UI,			},
		{ "srgb8_alpha8",		GL_SRGB8_ALPHA8,	},
		{ "rgb10_a2",			GL_RGB10_A2,		},
		{ "rgb10_a2ui",			GL_RGB10_A2UI,		},
		{ "rgba4",				GL_RGBA4,			},
		{ "rgb5_a1",			GL_RGB5_A1,			},
		{ "rgba8_snorm",		GL_RGBA8_SNORM,		},
		{ "rgb8",				GL_RGB8,			},
		{ "rgb565",				GL_RGB565,			},
		{ "r11f_g11f_b10f",		GL_R11F_G11F_B10F,	},
		{ "rgb32f",				GL_RGB32F,			},
		{ "rgb32i",				GL_RGB32I,			},
		{ "rgb32ui",			GL_RGB32UI,			},
		{ "rgb16f",				GL_RGB16F,			},
		{ "rgb16i",				GL_RGB16I,			},
		{ "rgb16ui",			GL_RGB16UI,			},
		{ "rgb8_snorm",			GL_RGB8_SNORM,		},
		{ "rgb8i",				GL_RGB8I,			},
		{ "rgb8ui",				GL_RGB8UI,			},
		{ "srgb8",				GL_SRGB8,			},
		{ "rgb9_e5",			GL_RGB9_E5,			},
		{ "rg32f",				GL_RG32F,			},
		{ "rg32i",				GL_RG32I,			},
		{ "rg32ui",				GL_RG32UI,			},
		{ "rg16f",				GL_RG16F,			},
		{ "rg16i",				GL_RG16I,			},
		{ "rg16ui",				GL_RG16UI,			},
		{ "rg8",				GL_RG8,				},
		{ "rg8i",				GL_RG8I,			},
		{ "rg8ui",				GL_RG8UI,			},
		{ "rg8_snorm",			GL_RG8_SNORM,		},
		{ "r32f",				GL_R32F,			},
		{ "r32i",				GL_R32I,			},
		{ "r32ui",				GL_R32UI,			},
		{ "r16f",				GL_R16F,			},
		{ "r16i",				GL_R16I,			},
		{ "r16ui",				GL_R16UI,			},
		{ "r8",					GL_R8,				},
		{ "r8i",				GL_R8I,				},
		{ "r8ui",				GL_R8UI,			},
		{ "r8_snorm",			GL_R8_SNORM,		}
	};

	struct
	{
		const char*	name;
		deUint32	internalFormat;
	} sizedDepthStencilFormats[] =
	{
		// Depth and stencil formats
		{ "depth_component32f",	GL_DEPTH_COMPONENT32F	},
		{ "depth_component24",	GL_DEPTH_COMPONENT24	},
		{ "depth_component16",	GL_DEPTH_COMPONENT16	},
		{ "depth32f_stencil8",	GL_DEPTH32F_STENCIL8	},
		{ "depth24_stencil8",	GL_DEPTH24_STENCIL8		}
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(sizedColorFormats); formatNdx++)
	{
		deUint32	internalFormat	= sizedColorFormats[formatNdx].internalFormat;
		string		nameBase		= sizedColorFormats[formatNdx].name;
		string		descriptionBase	= glu::getTextureFormatName(internalFormat);

		sizedCubeArrayGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), internalFormat, 64, 12));
		sizedCubeArrayGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), internalFormat, 64, 12));
	}

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(sizedDepthStencilFormats); formatNdx++)
	{
		deUint32	internalFormat	= sizedDepthStencilFormats[formatNdx].internalFormat;
		string		nameBase		= sizedDepthStencilFormats[formatNdx].name;
		string		descriptionBase	= glu::getTextureFormatName(internalFormat);

		sizedCubeArrayGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), internalFormat, 64, 12));
		sizedCubeArrayGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), internalFormat, 64, 12));
	}

	// \todo Check
	struct
	{
		const char*	name;
		deUint32	internalFormat;
	} bufferColorFormats[] =
	{
		{ "r8",					GL_R8,				},
		{ "r16f",				GL_R16F,			},
		{ "r32f",				GL_R32F,			},
		{ "r8i",				GL_R8I,				},
		{ "r16i",				GL_R16I,			},
		{ "r32i",				GL_R32I,			},
		{ "r8ui",				GL_R8UI,			},
		{ "r16ui",				GL_R16UI,			},
		{ "r32ui",				GL_R32UI,			},
		{ "rg8",				GL_RG8,				},
		{ "rg16f",				GL_RG16F,			},
		{ "rg32f",				GL_RG32F,			},
		{ "rg8i",				GL_RG8I,			},
		{ "rg16i",				GL_RG16I,			},
		{ "rg32i",				GL_RG32I,			},
		{ "rg8ui",				GL_RG8UI,			},
		{ "rg16ui",				GL_RG16UI,			},
		{ "rg32ui",				GL_RG32UI,			},
		{ "rgba8",				GL_RGBA8,			},
		{ "rgba16f",			GL_RGBA16F,			},
		{ "rgba32f",			GL_RGBA32F,			},
		{ "rgba8i",				GL_RGBA8I,			},
		{ "rgba16i",			GL_RGBA16I,			},
		{ "rgba32i",			GL_RGBA32I,			},
		{ "rgba8ui",			GL_RGBA8UI,			},
		{ "rgba16ui",			GL_RGBA16UI,		},
		{ "rgba32ui",			GL_RGBA32UI,		}
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(bufferColorFormats); formatNdx++)
	{
		deUint32	internalFormat	= bufferColorFormats[formatNdx].internalFormat;
		string		nameBase		= bufferColorFormats[formatNdx].name;
		string		descriptionBase	= glu::getTextureFormatName(internalFormat);

		sizedBufferGroup->addChild	(new TextureBufferFormatCase	(m_context, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_BUFFER").c_str(),	internalFormat, 64));
		sizedBufferGroup->addChild	(new TextureBufferFormatCase	(m_context, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_BUFFER").c_str(),	internalFormat, 112));
	}
}